

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O2

block dpf_seed(block *seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  size_t in_RAX;
  undefined4 extraout_var;
  longlong in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  uint uVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  block alVar14;
  block cur_seed;
  
  current_rand_index = 0;
  if (seed == (block *)0x0) {
    iVar9 = RAND_bytes((uchar *)cur_seed,0x10);
    in_RAX = CONCAT44(extraout_var,iVar9);
    in_RDX = extraout_RDX;
    seed = &cur_seed;
    if (iVar9 == 0) {
      in_RAX = fwrite("** unable to seed securely\n",0x1b,1,_stderr);
      in_RDX = extraout_RDX_00;
      goto LAB_001020e8;
    }
  }
  rand_aes_key.rd_key[0] = *seed;
  auVar11 = aeskeygenassist((undefined1  [16])rand_aes_key.rd_key[0],1);
  uVar10 = (uint)rand_aes_key.rd_key[0][0];
  uVar13 = (uint)rand_aes_key.rd_key[0][1] ^ rand_aes_key.rd_key[0][0]._4_4_;
  uVar12 = auVar11._12_4_;
  rand_aes_key.rd_key[1][0]._0_4_ = uVar10 ^ uVar12;
  rand_aes_key.rd_key[1][0]._4_4_ = uVar10 ^ rand_aes_key.rd_key[0][0]._4_4_ ^ uVar12;
  rand_aes_key.rd_key[1][1]._0_4_ = uVar10 ^ uVar13 ^ uVar12;
  rand_aes_key.rd_key[1][1]._4_4_ = uVar13 ^ rand_aes_key.rd_key[0][1]._4_4_ ^ uVar10 ^ uVar12;
  auVar11._4_4_ = rand_aes_key.rd_key[1][0]._4_4_;
  auVar11._0_4_ = (uint)rand_aes_key.rd_key[1][0];
  auVar11._8_4_ = (uint)rand_aes_key.rd_key[1][1];
  auVar11._12_4_ = rand_aes_key.rd_key[1][1]._4_4_;
  auVar11 = aeskeygenassist(auVar11,2);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[2][0]._0_4_ = (uint)rand_aes_key.rd_key[1][0] ^ uVar10;
  rand_aes_key.rd_key[2][0]._4_4_ =
       (uint)rand_aes_key.rd_key[1][0] ^ rand_aes_key.rd_key[1][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[2][1]._0_4_ =
       (uint)rand_aes_key.rd_key[1][0] ^
       (uint)rand_aes_key.rd_key[1][1] ^ rand_aes_key.rd_key[1][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[2][1]._4_4_ =
       (uint)rand_aes_key.rd_key[1][1] ^ rand_aes_key.rd_key[1][0]._4_4_ ^
       rand_aes_key.rd_key[1][1]._4_4_ ^ (uint)rand_aes_key.rd_key[1][0] ^ uVar10;
  auVar5._4_4_ = rand_aes_key.rd_key[2][0]._4_4_;
  auVar5._0_4_ = (uint)rand_aes_key.rd_key[2][0];
  auVar5._8_4_ = (uint)rand_aes_key.rd_key[2][1];
  auVar5._12_4_ = rand_aes_key.rd_key[2][1]._4_4_;
  auVar11 = aeskeygenassist(auVar5,4);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[3][0]._0_4_ = (uint)rand_aes_key.rd_key[2][0] ^ uVar10;
  rand_aes_key.rd_key[3][0]._4_4_ =
       (uint)rand_aes_key.rd_key[2][0] ^ rand_aes_key.rd_key[2][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[3][1]._0_4_ =
       (uint)rand_aes_key.rd_key[2][0] ^
       (uint)rand_aes_key.rd_key[2][1] ^ rand_aes_key.rd_key[2][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[3][1]._4_4_ =
       (uint)rand_aes_key.rd_key[2][1] ^ rand_aes_key.rd_key[2][0]._4_4_ ^
       rand_aes_key.rd_key[2][1]._4_4_ ^ (uint)rand_aes_key.rd_key[2][0] ^ uVar10;
  auVar1._4_4_ = rand_aes_key.rd_key[3][0]._4_4_;
  auVar1._0_4_ = (uint)rand_aes_key.rd_key[3][0];
  auVar1._8_4_ = (uint)rand_aes_key.rd_key[3][1];
  auVar1._12_4_ = rand_aes_key.rd_key[3][1]._4_4_;
  auVar11 = aeskeygenassist(auVar1,8);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[4][0]._0_4_ = (uint)rand_aes_key.rd_key[3][0] ^ uVar10;
  rand_aes_key.rd_key[4][0]._4_4_ =
       (uint)rand_aes_key.rd_key[3][0] ^ rand_aes_key.rd_key[3][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[4][1]._0_4_ =
       (uint)rand_aes_key.rd_key[3][0] ^
       (uint)rand_aes_key.rd_key[3][1] ^ rand_aes_key.rd_key[3][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[4][1]._4_4_ =
       (uint)rand_aes_key.rd_key[3][1] ^ rand_aes_key.rd_key[3][0]._4_4_ ^
       rand_aes_key.rd_key[3][1]._4_4_ ^ (uint)rand_aes_key.rd_key[3][0] ^ uVar10;
  auVar6._4_4_ = rand_aes_key.rd_key[4][0]._4_4_;
  auVar6._0_4_ = (uint)rand_aes_key.rd_key[4][0];
  auVar6._8_4_ = (uint)rand_aes_key.rd_key[4][1];
  auVar6._12_4_ = rand_aes_key.rd_key[4][1]._4_4_;
  auVar11 = aeskeygenassist(auVar6,0x10);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[5][0]._0_4_ = (uint)rand_aes_key.rd_key[4][0] ^ uVar10;
  rand_aes_key.rd_key[5][0]._4_4_ =
       (uint)rand_aes_key.rd_key[4][0] ^ rand_aes_key.rd_key[4][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[5][1]._0_4_ =
       (uint)rand_aes_key.rd_key[4][0] ^
       (uint)rand_aes_key.rd_key[4][1] ^ rand_aes_key.rd_key[4][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[5][1]._4_4_ =
       (uint)rand_aes_key.rd_key[4][1] ^ rand_aes_key.rd_key[4][0]._4_4_ ^
       rand_aes_key.rd_key[4][1]._4_4_ ^ (uint)rand_aes_key.rd_key[4][0] ^ uVar10;
  auVar2._4_4_ = rand_aes_key.rd_key[5][0]._4_4_;
  auVar2._0_4_ = (uint)rand_aes_key.rd_key[5][0];
  auVar2._8_4_ = (uint)rand_aes_key.rd_key[5][1];
  auVar2._12_4_ = rand_aes_key.rd_key[5][1]._4_4_;
  auVar11 = aeskeygenassist(auVar2,0x20);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[6][0]._0_4_ = (uint)rand_aes_key.rd_key[5][0] ^ uVar10;
  rand_aes_key.rd_key[6][0]._4_4_ =
       (uint)rand_aes_key.rd_key[5][0] ^ rand_aes_key.rd_key[5][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[6][1]._0_4_ =
       (uint)rand_aes_key.rd_key[5][0] ^
       (uint)rand_aes_key.rd_key[5][1] ^ rand_aes_key.rd_key[5][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[6][1]._4_4_ =
       (uint)rand_aes_key.rd_key[5][1] ^ rand_aes_key.rd_key[5][0]._4_4_ ^
       rand_aes_key.rd_key[5][1]._4_4_ ^ (uint)rand_aes_key.rd_key[5][0] ^ uVar10;
  auVar7._4_4_ = rand_aes_key.rd_key[6][0]._4_4_;
  auVar7._0_4_ = (uint)rand_aes_key.rd_key[6][0];
  auVar7._8_4_ = (uint)rand_aes_key.rd_key[6][1];
  auVar7._12_4_ = rand_aes_key.rd_key[6][1]._4_4_;
  auVar11 = aeskeygenassist(auVar7,0x40);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[7][0]._0_4_ = (uint)rand_aes_key.rd_key[6][0] ^ uVar10;
  rand_aes_key.rd_key[7][0]._4_4_ =
       (uint)rand_aes_key.rd_key[6][0] ^ rand_aes_key.rd_key[6][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[7][1]._0_4_ =
       (uint)rand_aes_key.rd_key[6][0] ^
       (uint)rand_aes_key.rd_key[6][1] ^ rand_aes_key.rd_key[6][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[7][1]._4_4_ =
       (uint)rand_aes_key.rd_key[6][1] ^ rand_aes_key.rd_key[6][0]._4_4_ ^
       rand_aes_key.rd_key[6][1]._4_4_ ^ (uint)rand_aes_key.rd_key[6][0] ^ uVar10;
  auVar3._4_4_ = rand_aes_key.rd_key[7][0]._4_4_;
  auVar3._0_4_ = (uint)rand_aes_key.rd_key[7][0];
  auVar3._8_4_ = (uint)rand_aes_key.rd_key[7][1];
  auVar3._12_4_ = rand_aes_key.rd_key[7][1]._4_4_;
  auVar11 = aeskeygenassist(auVar3,0x80);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[8][0]._0_4_ = (uint)rand_aes_key.rd_key[7][0] ^ uVar10;
  rand_aes_key.rd_key[8][0]._4_4_ =
       (uint)rand_aes_key.rd_key[7][0] ^ rand_aes_key.rd_key[7][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[8][1]._0_4_ =
       (uint)rand_aes_key.rd_key[7][0] ^
       (uint)rand_aes_key.rd_key[7][1] ^ rand_aes_key.rd_key[7][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[8][1]._4_4_ =
       (uint)rand_aes_key.rd_key[7][1] ^ rand_aes_key.rd_key[7][0]._4_4_ ^
       rand_aes_key.rd_key[7][1]._4_4_ ^ (uint)rand_aes_key.rd_key[7][0] ^ uVar10;
  auVar8._4_4_ = rand_aes_key.rd_key[8][0]._4_4_;
  auVar8._0_4_ = (uint)rand_aes_key.rd_key[8][0];
  auVar8._8_4_ = (uint)rand_aes_key.rd_key[8][1];
  auVar8._12_4_ = rand_aes_key.rd_key[8][1]._4_4_;
  auVar11 = aeskeygenassist(auVar8,0x1b);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[9][0]._0_4_ = (uint)rand_aes_key.rd_key[8][0] ^ uVar10;
  rand_aes_key.rd_key[9][0]._4_4_ =
       (uint)rand_aes_key.rd_key[8][0] ^ rand_aes_key.rd_key[8][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[9][1]._0_4_ =
       (uint)rand_aes_key.rd_key[8][0] ^
       (uint)rand_aes_key.rd_key[8][1] ^ rand_aes_key.rd_key[8][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[9][1]._4_4_ =
       (uint)rand_aes_key.rd_key[8][1] ^ rand_aes_key.rd_key[8][0]._4_4_ ^
       rand_aes_key.rd_key[8][1]._4_4_ ^ (uint)rand_aes_key.rd_key[8][0] ^ uVar10;
  auVar4._4_4_ = rand_aes_key.rd_key[9][0]._4_4_;
  auVar4._0_4_ = (uint)rand_aes_key.rd_key[9][0];
  auVar4._8_4_ = (uint)rand_aes_key.rd_key[9][1];
  auVar4._12_4_ = rand_aes_key.rd_key[9][1]._4_4_;
  auVar11 = aeskeygenassist(auVar4,0x36);
  uVar10 = auVar11._12_4_;
  rand_aes_key.rd_key[10][0]._0_4_ = (uint)rand_aes_key.rd_key[9][0] ^ uVar10;
  rand_aes_key.rd_key[10][0]._4_4_ =
       (uint)rand_aes_key.rd_key[9][0] ^ rand_aes_key.rd_key[9][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[10][1]._0_4_ =
       (uint)rand_aes_key.rd_key[9][0] ^
       (uint)rand_aes_key.rd_key[9][1] ^ rand_aes_key.rd_key[9][0]._4_4_ ^ uVar10;
  rand_aes_key.rd_key[10][1]._4_4_ =
       (uint)rand_aes_key.rd_key[9][1] ^ rand_aes_key.rd_key[9][0]._4_4_ ^
       rand_aes_key.rd_key[9][1]._4_4_ ^ (uint)rand_aes_key.rd_key[9][0] ^ uVar10;
  rand_aes_key.rounds = 10;
LAB_001020e8:
  alVar14[1] = in_RDX;
  alVar14[0] = in_RAX;
  return alVar14;
}

Assistant:

block
dpf_seed(block *seed)
{
    block cur_seed;
    current_rand_index = 0;
    if (seed) {
        cur_seed = *seed;
    } else {
        if (RAND_bytes((unsigned char *) &cur_seed, 16) == 0) {
            fprintf(stderr, "** unable to seed securely\n");
            return dpf_zero_block();
        }
    }
    AES_set_encrypt_key(cur_seed, &rand_aes_key);
    return cur_seed;
}